

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# atcp.c
# Opt level: O0

void nn_atcp_term(nn_atcp *self)

{
  long in_RDI;
  
  if (*(int *)(in_RDI + 0x58) != 1) {
    nn_backtrace_print();
    fprintf(_stderr,"Assertion failed: %d == %s (%s:%d)\n",(ulong)*(uint *)(in_RDI + 0x58),
            "NN_ATCP_STATE_IDLE",
            "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/vendor/nanomsg/src/transports/tcp/atcp.c"
            ,0x4d);
    fflush(_stderr);
    nn_err_abort();
  }
  nn_list_item_term((nn_list_item *)0x201a1b);
  nn_fsm_event_term((nn_fsm_event *)(in_RDI + 0x6f8));
  nn_fsm_event_term((nn_fsm_event *)(in_RDI + 0x6d0));
  nn_stcp_term((nn_stcp *)0x201a4b);
  nn_usock_term((nn_usock *)0x201a58);
  nn_fsm_term((nn_fsm *)0x201a61);
  return;
}

Assistant:

void nn_atcp_term (struct nn_atcp *self)
{
    nn_assert_state (self, NN_ATCP_STATE_IDLE);

    nn_list_item_term (&self->item);
    nn_fsm_event_term (&self->done);
    nn_fsm_event_term (&self->accepted);
    nn_stcp_term (&self->stcp);
    nn_usock_term (&self->usock);
    nn_fsm_term (&self->fsm);
}